

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

bool QtPrivate::QLessThanOperatorForType<QDBusObjectPath,_true>::lessThan
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  QArrayData *pQVar1;
  storage_type_conflict *psVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  storage_type_conflict *psVar5;
  qsizetype qVar6;
  byte extraout_var;
  QStringView QVar7;
  QStringView QVar8;
  
  pQVar1 = *a;
  psVar2 = *(storage_type_conflict **)((long)a + 8);
  qVar3 = *(qsizetype *)((long)a + 0x10);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar4 = *b;
  psVar5 = *(storage_type_conflict **)((long)b + 8);
  qVar6 = *(qsizetype *)((long)b + 0x10);
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar7.m_data = psVar2;
  QVar7.m_size = qVar3;
  QVar8.m_data = psVar5;
  QVar8.m_size = qVar6;
  QtPrivate::compareStrings(QVar7,QVar8,CaseSensitive);
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  return (bool)(extraout_var >> 7);
}

Assistant:

static bool lessThan(const QMetaTypeInterface *, const void *a, const void *b)
    { return *reinterpret_cast<const T *>(a) < *reinterpret_cast<const T *>(b); }